

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

bool google::protobuf::util::FieldMaskUtil::FromJsonString(string_view str,FieldMask *out)

{
  bool bVar1;
  string *psVar2;
  string *in_RCX;
  pointer pbVar3;
  string_view input;
  string snakecase_path;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  paths;
  ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
  local_69;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_68;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_48;
  
  FieldMask::Clear(out);
  local_68.delimiter_.c_ = ',';
  local_68.text_._M_len = (size_t)str._M_len;
  local_68.text_._M_str = str._M_str;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
  ::operator()(&local_48,&local_69,&local_68);
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    pbVar3 = local_48.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((FieldMaskUtil *)pbVar3->_M_len != (FieldMaskUtil *)0x0) {
        local_68.text_._M_str = (char *)0x0;
        local_68.delimiter_.c_ = '\0';
        input._M_str = (char *)&local_68;
        input._M_len = (size_t)pbVar3->_M_str;
        local_68.text_._M_len = (size_t)&local_68.delimiter_;
        bVar1 = CamelCaseToSnakeCase((FieldMaskUtil *)pbVar3->_M_len,input,in_RCX);
        if (bVar1) {
          psVar2 = (string *)
                   protobuf::internal::RepeatedPtrFieldBase::AddString
                             ((RepeatedPtrFieldBase *)&(out->field_0)._impl_);
          std::__cxx11::string::_M_assign(psVar2);
        }
        if ((ByChar *)local_68.text_._M_len != &local_68.delimiter_) {
          operator_delete((void *)local_68.text_._M_len,
                          CONCAT71(local_68._17_7_,local_68.delimiter_.c_) + 1);
        }
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00fc0b4d;
        }
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != local_48.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    bVar1 = true;
  }
LAB_00fc0b4d:
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool FieldMaskUtil::FromJsonString(absl::string_view str, FieldMask* out) {
  out->Clear();
  std::vector<absl::string_view> paths = absl::StrSplit(str, ',');
  for (absl::string_view path : paths) {
    if (path.empty()) continue;
    std::string snakecase_path;
    if (!CamelCaseToSnakeCase(path, &snakecase_path)) {
      return false;
    }
    out->add_paths(snakecase_path);
  }
  return true;
}